

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts3PendingTermsFlush(Fts3Table *p)

{
  long in_RDI;
  sqlite3_stmt *in_stack_00000008;
  sqlite3_stmt *pStmt;
  int i;
  int rc;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  Fts3Table *in_stack_000000a0;
  sqlite3_value **in_stack_00000148;
  sqlite3_stmt **in_stack_00000150;
  int in_stack_0000015c;
  Fts3Table *in_stack_00000160;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined7 in_stack_ffffffffffffffe0;
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  iVar2 = 0;
  while( true ) {
    uVar1 = false;
    if (iVar3 == 0) {
      uVar1 = iVar2 < *(int *)(in_RDI + 0x1d8);
    }
    if ((bool)uVar1 == false) break;
    iVar3 = fts3SegmentMerge(in_stack_000000a0,in_stack_0000009c,in_stack_00000098,in_stack_00000094
                            );
    if (iVar3 == 0x65) {
      iVar3 = 0;
    }
    iVar2 = iVar2 + 1;
  }
  sqlite3Fts3PendingTermsClear((Fts3Table *)CONCAT44(iVar3,iVar2));
  if ((((iVar3 == 0) && (*(char *)(in_RDI + 0x1bd) != '\0')) && (*(int *)(in_RDI + 0x60) == 0xff))
     && ((*(int *)(in_RDI + 100) != 0 &&
         (iVar3 = fts3SqlStmt(in_stack_00000160,in_stack_0000015c,in_stack_00000150,
                              in_stack_00000148), iVar3 == 0)))) {
    sqlite3_bind_int((sqlite3_stmt *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    iVar2 = sqlite3_step(in_stack_00000008);
    if (iVar2 == 100) {
      iVar2 = sqlite3_column_int((sqlite3_stmt *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
                                 in_stack_ffffffffffffffdc);
      *(int *)(in_RDI + 0x60) = iVar2;
      if (*(int *)(in_RDI + 0x60) == 1) {
        *(undefined4 *)(in_RDI + 0x60) = 8;
      }
    }
    else if (iVar2 == 0x65) {
      *(undefined4 *)(in_RDI + 0x60) = 0;
    }
    iVar3 = sqlite3_reset((sqlite3_stmt *)CONCAT17(uVar1,in_stack_ffffffffffffffe0));
  }
  return iVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3PendingTermsFlush(Fts3Table *p){
  int rc = SQLITE_OK;
  int i;
        
  for(i=0; rc==SQLITE_OK && i<p->nIndex; i++){
    rc = fts3SegmentMerge(p, p->iPrevLangid, i, FTS3_SEGCURSOR_PENDING);
    if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  }
  sqlite3Fts3PendingTermsClear(p);

  /* Determine the auto-incr-merge setting if unknown.  If enabled,
  ** estimate the number of leaf blocks of content to be written
  */
  if( rc==SQLITE_OK && p->bHasStat
   && p->nAutoincrmerge==0xff && p->nLeafAdd>0
  ){
    sqlite3_stmt *pStmt = 0;
    rc = fts3SqlStmt(p, SQL_SELECT_STAT, &pStmt, 0);
    if( rc==SQLITE_OK ){
      sqlite3_bind_int(pStmt, 1, FTS_STAT_AUTOINCRMERGE);
      rc = sqlite3_step(pStmt);
      if( rc==SQLITE_ROW ){
        p->nAutoincrmerge = sqlite3_column_int(pStmt, 0);
        if( p->nAutoincrmerge==1 ) p->nAutoincrmerge = 8;
      }else if( rc==SQLITE_DONE ){
        p->nAutoincrmerge = 0;
      }
      rc = sqlite3_reset(pStmt);
    }
  }
  return rc;
}